

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_restart(int nargs,char **args)

{
  service *psVar1;
  undefined4 in_EDI;
  service *svc;
  char *in_stack_00000308;
  service *in_stack_00000310;
  undefined4 in_stack_fffffffffffffff8;
  
  psVar1 = service_find_by_name((char *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  if (psVar1 != (service *)0x0) {
    service_stop((service *)0x10537f);
    service_start(in_stack_00000310,in_stack_00000308);
  }
  return 0;
}

Assistant:

int do_restart(int nargs, char **args)
{
    struct service *svc;
    svc = service_find_by_name(args[1]);
    if (svc) {
        service_stop(svc);
        service_start(svc, NULL);
    }
    return 0;
}